

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall
minja::IfTemplateToken::IfTemplateToken
          (IfTemplateToken *this,Location *loc,SpaceHandling pre,SpaceHandling post,
          shared_ptr<minja::Expression> *c)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  TemplateToken::TemplateToken(&this->super_TemplateToken,If,loc,pre,post);
  (this->super_TemplateToken)._vptr_TemplateToken = (_func_int **)&PTR__IfTemplateToken_0022e088;
  (this->condition).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (c->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (c->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (c->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->condition).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->condition).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  (c->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  return;
}

Assistant:

IfTemplateToken(const Location & loc, SpaceHandling pre, SpaceHandling post, std::shared_ptr<Expression> && c) : TemplateToken(Type::If, loc, pre, post), condition(std::move(c)) {}